

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void obj_from_char(OBJ_DATA *obj)

{
  CHAR_DATA *ch;
  OBJ_DATA *pOVar1;
  short sVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  string_view fmt;
  string_view fmt_00;
  
  ch = obj->carried_by;
  if (ch == (CHAR_DATA *)0x0) {
    fmt._M_str = "Obj_from_char: null ch.";
    fmt._M_len = 0x17;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  if (obj->wear_loc != -1) {
    unequip_char(ch,obj,true);
  }
  pOVar1 = ch->carrying;
  if (ch->carrying == obj) {
    ch->carrying = obj->next_content;
  }
  else {
    do {
      pOVar4 = pOVar1;
      if (pOVar4 == (OBJ_DATA *)0x0) {
        fmt_00._M_str = "Obj_from_char: obj not in list.";
        fmt_00._M_len = 0x1f;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
        goto LAB_002f8dda;
      }
      pOVar1 = pOVar4->next_content;
    } while (pOVar4->next_content != obj);
    pOVar4->next_content = obj->next_content;
  }
LAB_002f8dda:
  obj->carried_by = (CHAR_DATA *)0x0;
  obj->next_content = (OBJ_DATA *)0x0;
  if ((obj->wear_loc == 0x13) ||
     (((ulong)(ushort)obj->item_type < 0x22 &&
      ((0x300100000U >> ((ulong)(ushort)obj->item_type & 0x3f) & 1) != 0)))) {
    sVar2 = 0;
  }
  else {
    sVar2 = -1;
  }
  ch->carry_number = ch->carry_number + sVar2;
  iVar3 = get_obj_weight(obj);
  ch->carry_weight = ch->carry_weight - (short)iVar3;
  return;
}

Assistant:

void obj_from_char(OBJ_DATA *obj)
{
	CHAR_DATA *ch;

	if ((ch = obj->carried_by) == nullptr)
	{
		RS.Logger.Debug("Obj_from_char: null ch.");
		return;
	}

	if (obj->wear_loc != WEAR_NONE)
		unequip_char(ch, obj, true);

	if (ch->carrying == obj)
	{
		ch->carrying = obj->next_content;
	}
	else
	{
		OBJ_DATA *prev;

		for (prev = ch->carrying; prev != nullptr; prev = prev->next_content)
		{
			if (prev->next_content == obj)
			{
				prev->next_content = obj->next_content;
				break;
			}
		}

		if (prev == nullptr)
			RS.Logger.Warn("Obj_from_char: obj not in list.");
	}

	obj->carried_by = nullptr;
	obj->next_content = nullptr;
	ch->carry_number -= get_obj_number(obj);
	ch->carry_weight -= get_obj_weight(obj);
}